

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::setUserInfo(XMLUri *this,XMLCh *newUserInfo)

{
  XMLCh *pXVar1;
  MalformedURLException *this_00;
  XMLCh *newUserInfo_local;
  XMLUri *this_local;
  
  if (newUserInfo != (XMLCh *)0x0) {
    pXVar1 = getHost(this);
    if (pXVar1 == (XMLCh *)0x0) {
      this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x48b,XMLNUM_URI_NullHost,(XMLCh *)errMsg_USERINFO,newUserInfo,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(this_00,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
  }
  isConformantUserInfo(newUserInfo,this->fMemoryManager);
  pXVar1 = getUserInfo(this);
  if (pXVar1 != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
  }
  if ((newUserInfo == (XMLCh *)0x0) || (*newUserInfo == L'\0')) {
    this->fUserInfo = (XMLCh *)0x0;
  }
  else {
    pXVar1 = XMLString::replicate(newUserInfo,this->fMemoryManager);
    this->fUserInfo = pXVar1;
  }
  return;
}

Assistant:

void XMLUri::setUserInfo(const XMLCh* const newUserInfo)
{
    if ( newUserInfo &&
         !getHost()    )
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_NullHost
                , errMsg_USERINFO
                , newUserInfo
                , fMemoryManager);
    }

    isConformantUserInfo(newUserInfo, fMemoryManager);

    if (getUserInfo())
    {
        fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
    }

    //sometimes we get passed a empty string rather than a null.
    //Other procedures rely on it being null
    if(newUserInfo && *newUserInfo) {
        fUserInfo = XMLString::replicate(newUserInfo, fMemoryManager);
    }
    else
        fUserInfo = 0;

}